

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedShaderImpl.cpp
# Opt level: O1

SHADER_STATUS __thiscall
Diligent::SerializedShaderImpl::GetStatus(SerializedShaderImpl *this,bool WaitForCompletion)

{
  _Head_base<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_false> _Var1;
  bool bVar2;
  int iVar3;
  SHADER_STATUS SVar4;
  long lVar5;
  string msg;
  string local_50;
  
  SVar4 = SHADER_STATUS_READY;
  lVar5 = 0;
  do {
    _Var1._M_head_impl =
         (this->m_Shaders)._M_elems[lVar5]._M_t.
         super___uniq_ptr_impl<Diligent::SerializedShaderImpl::CompiledShader,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
         ._M_t.
         super__Tuple_impl<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
         .super__Head_base<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_false>.
         _M_head_impl;
    if (_Var1._M_head_impl == (CompiledShader *)0x0) {
      bVar2 = false;
      goto LAB_001c82be;
    }
    iVar3 = (*(_Var1._M_head_impl)->_vptr_CompiledShader[4])(_Var1._M_head_impl,WaitForCompletion);
    switch(iVar3) {
    case 0:
      FormatString<char[40]>(&local_50,(char (*) [40])"Shader status must not be uninitialized");
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"GetStatus",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedShaderImpl.cpp"
                 ,0xd0);
      goto LAB_001c82a0;
    case 1:
      SVar4 = SHADER_STATUS_COMPILING;
      break;
    case 2:
      break;
    case 3:
      bVar2 = true;
      goto LAB_001c82be;
    default:
      FormatString<char[25]>(&local_50,(char (*) [25])"Unexpected shader status");
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"GetStatus",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedShaderImpl.cpp"
                 ,0xdf);
LAB_001c82a0:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    bVar2 = false;
LAB_001c82be:
    if (bVar2) {
      return SHADER_STATUS_FAILED;
    }
    lVar5 = lVar5 + 1;
    if (lVar5 == 7) {
      return SVar4;
    }
  } while( true );
}

Assistant:

SHADER_STATUS SerializedShaderImpl::GetStatus(bool WaitForCompletion)
{
    SHADER_STATUS OverallStatus = SHADER_STATUS_READY;
    for (size_t type = 0; type < static_cast<size_t>(DeviceType::Count); ++type)
    {
        const auto& pCompiledShader = m_Shaders[type];
        if (!pCompiledShader)
            continue;

        const SHADER_STATUS Status = pCompiledShader->GetStatus(WaitForCompletion);
        switch (Status)
        {
            case SHADER_STATUS_UNINITIALIZED:
                UNEXPECTED("Shader status must not be uninitialized");
                break;

            case SHADER_STATUS_COMPILING:
                OverallStatus = SHADER_STATUS_COMPILING;
                break;

            case SHADER_STATUS_READY:
                // Nothing to do
                break;

            case SHADER_STATUS_FAILED:
                return SHADER_STATUS_FAILED;

            default:
                UNEXPECTED("Unexpected shader status");
                break;
        }
    }

    return OverallStatus;
}